

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Minisat::sort<unsigned_int,reduceDB_c>(uint *array,int size,reduceDB_c lt)

{
  bool bVar1;
  uint *in_RDX;
  CRef in_ESI;
  reduceDB_c in_RDI;
  reduceDB_c unaff_retaddr;
  int j;
  int i;
  uint tmp;
  uint pivot;
  undefined8 in_stack_ffffffffffffffb0;
  uint *in_stack_ffffffffffffffb8;
  reduceDB_c in_stack_ffffffffffffffc0;
  CRef x;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  undefined8 in_stack_ffffffffffffffe0;
  int size_00;
  undefined4 in_stack_ffffffffffffffe8;
  CRef CVar3;
  
  if ((int)in_ESI < 0x10) {
    selectionSort<unsigned_int,reduceDB_c>
              (in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
               in_stack_ffffffffffffffc0);
  }
  else if ((int)in_ESI < 0x21) {
    uVar2 = *(undefined4 *)
             ((long)&((in_RDI.ca)->super_RegionAllocator<unsigned_int>).memory +
             (long)((int)in_ESI / 2) * 4);
    x = 0xffffffff;
    CVar3 = in_ESI;
    while( true ) {
      do {
        x = x + 1;
        bVar1 = reduceDB_c::operator()
                          ((reduceDB_c *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),x,in_ESI);
      } while (bVar1);
      do {
        in_ESI = in_ESI - 1;
        bVar1 = reduceDB_c::operator()
                          ((reduceDB_c *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),x,in_ESI);
        size_00 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
      } while (bVar1);
      if ((int)in_ESI <= (int)x) break;
      in_stack_ffffffffffffffd0 =
           *(undefined4 *)
            ((long)&((in_RDI.ca)->super_RegionAllocator<unsigned_int>).memory + (long)(int)x * 4);
      *(undefined4 *)
       ((long)&((in_RDI.ca)->super_RegionAllocator<unsigned_int>).memory + (long)(int)x * 4) =
           *(undefined4 *)
            ((long)&((in_RDI.ca)->super_RegionAllocator<unsigned_int>).memory +
            (long)(int)in_ESI * 4);
      *(undefined4 *)
       ((long)&((in_RDI.ca)->super_RegionAllocator<unsigned_int>).memory + (long)(int)in_ESI * 4) =
           in_stack_ffffffffffffffd0;
    }
    sort<unsigned_int,reduceDB_c>((uint *)CONCAT44(CVar3,in_stack_ffffffffffffffe8),size_00,in_RDI);
    sort<unsigned_int,reduceDB_c>((uint *)CONCAT44(CVar3,in_stack_ffffffffffffffe8),size_00,in_RDI);
  }
  else {
    mergesort<unsigned_int,reduceDB_c>(in_RDX,(int32_t)((ulong)in_RDI.ca >> 0x20),unaff_retaddr);
  }
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}